

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O2

int Frc_ObjFanoutsAreCos(Frc_Obj_t *pThis)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  uVar1 = pThis->nFanouts;
  if ((int)pThis->nFanouts < 1) {
    uVar1 = 0;
  }
  do {
    if (uVar1 == (uint)lVar2) {
      return 1;
    }
    lVar3 = (ulong)(*(uint *)pThis >> 4) + lVar2;
    lVar2 = lVar2 + 1;
  } while (((&pThis->field_0x0)[(long)*(int *)(&pThis[1].field_0x0 + lVar3 * 4) * 4] & 2) != 0);
  return 0;
}

Assistant:

int Frc_ObjFanoutsAreCos( Frc_Obj_t * pThis )
{
    Frc_Obj_t * pNext;
    int i;
    Frc_ObjForEachFanout( pThis, pNext, i )
        if ( !Frc_ObjIsCo(pNext) )
            return 0;
    return 1;
}